

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushItemWidth(float item_width)

{
  int *piVar1;
  ImVector<float> *pIVar2;
  ImGuiWindow *pIVar3;
  float *pfVar4;
  ImGuiContext *pIVar5;
  int iVar6;
  float *__dest;
  int iVar7;
  int iVar8;
  ImGuiContext *ctx;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  iVar6 = (pIVar3->DC).ItemWidthStack.Size;
  if (iVar6 == (pIVar3->DC).ItemWidthStack.Capacity) {
    if (iVar6 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar6 / 2 + iVar6;
    }
    iVar8 = iVar6 + 1;
    if (iVar6 + 1 < iVar7) {
      iVar8 = iVar7;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (float *)(*GImAllocatorAllocFunc)((long)iVar8 << 2,GImAllocatorUserData);
    pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
    if (pfVar4 != (float *)0x0) {
      memcpy(__dest,pfVar4,(long)(pIVar3->DC).ItemWidthStack.Size << 2);
      pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
      if ((pfVar4 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pfVar4,GImAllocatorUserData);
    }
    (pIVar3->DC).ItemWidthStack.Data = __dest;
    (pIVar3->DC).ItemWidthStack.Capacity = iVar8;
    iVar6 = (pIVar3->DC).ItemWidthStack.Size;
  }
  else {
    __dest = (pIVar3->DC).ItemWidthStack.Data;
  }
  __dest[iVar6] = (pIVar3->DC).ItemWidth;
  pIVar2 = &(pIVar3->DC).ItemWidthStack;
  pIVar2->Size = pIVar2->Size + 1;
  if ((item_width == 0.0) && (!NAN(item_width))) {
    item_width = pIVar3->ItemWidthDefault;
  }
  (pIVar3->DC).ItemWidth = item_width;
  *(byte *)&(pIVar5->NextItemData).Flags = (byte)(pIVar5->NextItemData).Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushItemWidth(float item_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth); // Backup current width
    window->DC.ItemWidth = (item_width == 0.0f ? window->ItemWidthDefault : item_width);
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}